

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers_tests.cpp
# Opt level: O0

void __thiscall
iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test::Body
          (iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Fixed *fixed;
  char16_t **in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  type **in_stack_fffffffffffff9a8;
  AssertionHelper local_608;
  Fixed local_5d8;
  AssertionHelper local_450;
  Fixed local_420;
  string local_298;
  undefined1 local_278 [8];
  AssertionResult iutest_ar;
  LogChecker ck;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  string s;
  char16_t *p;
  iu_PrintToTest_x_iutest_x_SurrogatePairChar16T_Test *this_local;
  
  s.field_2._8_8_ = anon_var_dwarf_2feeb;
  iutest::PrintToString<char16_t_const*>
            ((string *)local_38,(iutest *)(s.field_2._M_local_buf + 8),in_RDX);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar2 == '?') {
    iutest::detail::AlwaysZero();
    bVar1 = iutest::detail::AlwaysTrue();
    if (bVar1) {
      memset(&local_1d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
      bVar1 = iutest::UnitTestImpl::SkipTest();
      pcVar2 = "Skipped. but already failed. ";
      if (bVar1) {
        pcVar2 = "Skipped. ";
      }
      iutest::AssertionHelper::AssertionHelper
                (&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
                 ,0x170,pcVar2,kSkip);
      iutest::AssertionHelper::operator=(&local_200,&local_1d0);
      iutest::AssertionHelper::~AssertionHelper(&local_200);
      iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
    }
  }
  else {
    LogChecker::LogChecker((LogChecker *)&iutest_ar.m_result,anon_var_dwarf_2fe21);
    iutest::detail::AlwaysZero();
    pcVar2 = LogCheckerBase::operator_cast_to_char_((LogCheckerBase *)&iutest_ar.m_result);
    iutest::PrintToString<std::__cxx11::string>(&local_298,(iutest *)local_38,v);
    iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
              ((AssertionResult *)local_278,(internal *)"static_cast<const char*>(ck)",
               "::iutest::PrintToString(s)",pcVar2,(char *)&local_298,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff9a8);
    std::__cxx11::string::~string((string *)&local_298);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
    if (!bVar1) {
      memset(&local_420,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_420);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_278);
      iutest::AssertionHelper::AssertionHelper
                (&local_450,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
                 ,0x177,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_450,&local_420);
      iutest::AssertionHelper::~AssertionHelper(&local_450);
      iutest::AssertionHelper::Fixed::~Fixed(&local_420);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_278);
    memset(&local_5d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_5d8,(char16_t *)s.field_2._8_8_);
    iutest::AssertionHelper::AssertionHelper
              (&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/printers_tests.cpp"
               ,0x178,"Succeeded.\n",kSuccess);
    iutest::AssertionHelper::operator=(&local_608,fixed);
    iutest::AssertionHelper::~AssertionHelper(&local_608);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
    LogChecker::~LogChecker((LogChecker *)&iutest_ar.m_result);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

IUTEST(PrintToTest, SurrogatePairChar16T)
{
    const char16_t* p = u"\U00020BB7";
    const ::std::string s = ::iutest::PrintToString(p);
    if( s[0] == '?' )
    {
        // FIXME
        IUTEST_SKIP();
    }
    else
    {
#if !defined(NO_TEST_SURROGATEPAIR)
        LogChecker ck("\U00020BB7");
        (void)ck;
        IUTEST_PRINTTOSTRING_EQ(ck, s);
        IUTEST_STREAMOUT_CHECK(p);
#endif
    }
}